

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O2

void select_tx_block(AV1_COMP *cpi,MACROBLOCK *x,int blk_row,int blk_col,int block,TX_SIZE tx_size,
                    int depth,BLOCK_SIZE plane_bsize,ENTROPY_CONTEXT *ta,ENTROPY_CONTEXT *tl,
                    TXFM_CONTEXT *tx_above,TXFM_CONTEXT *tx_left,RD_STATS *rd_stats,
                    int64_t prev_level_rd,int64_t ref_best_rd,int *is_cost_valid,
                    FAST_TX_SEARCH_MODE ftxs_mode)

{
  MACROBLOCKD *xd;
  byte bVar1;
  byte bVar2;
  TX_TYPE tx_type;
  short *psVar3;
  MB_MODE_INFO *pMVar4;
  NN_CONFIG *pNVar5;
  double dVar6;
  ulong uVar7;
  uint uVar8;
  char cVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int16_t *piVar16;
  bool bVar17;
  long lVar18;
  int iVar19;
  int plane;
  int iVar20;
  int col;
  uint __c;
  byte bVar21;
  ulong uVar22;
  uint8_t uVar23;
  int iVar24;
  int16_t *piVar25;
  int iVar26;
  ENTROPY_CONTEXT *__s;
  long lVar27;
  bool bVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  int local_240;
  int local_1ec;
  undefined1 local_1e8 [24];
  ulong local_1d0;
  double local_1c8;
  double dStack_1c0;
  long local_1b0;
  ulong local_1a8;
  long local_1a0;
  double local_198;
  long local_190;
  int x_sum;
  int iStack_184;
  int64_t iStack_180;
  long lStack_178;
  int64_t local_170;
  uint8_t local_168;
  undefined7 uStack_167;
  long local_160;
  MB_MODE_INFO *local_158;
  long local_150;
  TXFM_CONTEXT *local_148;
  TXFM_CONTEXT *local_140;
  float features [64];
  
  local_1e8._8_8_ = local_1e8._0_8_;
  rd_stats->rate = 0;
  rd_stats->zero_rate = 0;
  rd_stats->sse = 0;
  rd_stats->dist = 0;
  rd_stats->rdcost = 0;
  rd_stats->skip_txfm = '\x01';
  if (ref_best_rd < 0) {
    *is_cost_valid = 0;
    return;
  }
  local_1a8 = (ulong)(uint)depth;
  local_158 = *(x->e_mbd).mi;
  local_160 = (long)blk_col;
  local_140 = tx_above + local_160;
  local_1b0 = (long)blk_row;
  local_148 = tx_left + local_1b0;
  uVar22 = (ulong)tx_size;
  iVar12 = txfm_partition_context(local_140,local_148,local_158->bsize,tx_size);
  if (((cpi->oxcf).txfm_cfg.enable_tx64 != false) ||
     (bVar28 = false, (0x61810UL >> (uVar22 & 0x3f) & 1) == 0)) {
    if ((cpi->oxcf).txfm_cfg.enable_rect_tx == false) {
      bVar28 = *(int *)((long)tx_size_wide + (ulong)((uint)tx_size * 4)) ==
               *(int *)((long)tx_size_high + (ulong)((uint)tx_size * 4));
    }
    else {
      bVar28 = true;
    }
  }
  bVar17 = depth < 2 && tx_size != '\0';
  uVar7 = (ulong)plane_bsize;
  bVar10 = bVar17;
  if ((depth < 2 && tx_size != '\0') && (bVar28)) {
    lVar15 = (long)(cpi->sf).tx_sf.prune_tx_size_level;
    bVar28 = true;
    if (0 < lVar15) {
      bVar1 = block_size_wide[uVar7];
      iVar13 = *(int *)((long)tx_size_wide + (ulong)((uint)tx_size * 4));
      iVar19 = *(int *)((long)tx_size_high + (ulong)((uint)tx_size * 4));
      local_1d0 = (ulong)iVar19;
      iVar24 = iVar19 >> (iVar13 <= iVar19);
      iVar19 = iVar13 >> (iVar19 <= iVar13);
      local_198 = (double)(iVar19 * iVar24);
      piVar16 = x->plane[0].src_diff + (long)(int)(blk_row * (uint)bVar1 * 4) + (long)(blk_col * 4);
      local_190 = CONCAT44(local_190._4_4_,iVar24);
      local_1e8._0_16_ = ZEXT816(0);
      local_1c8._0_4_ = 0.0;
      fVar31 = 0.0;
      iVar26 = 0;
      lVar27 = 0;
      iVar20 = 0;
      lVar18 = 0;
      local_150 = lVar15;
      while (lVar18 < (long)local_1d0) {
        piVar25 = piVar16;
        local_1a0 = lVar18;
        for (lVar15 = 0; lVar15 < iVar13; lVar15 = lVar15 + iVar19) {
          (*aom_get_blk_sse_sum)
                    (piVar25,(uint)bVar1,iVar19,(int)local_190,&x_sum,(int64_t *)features);
          iVar20 = iVar20 + x_sum;
          lVar27 = lVar27 + CONCAT44(features[1],features[0]);
          fVar29 = (float)x_sum / (float)(iVar19 * iVar24);
          fVar30 = (float)((double)CONCAT44(features[1],features[0]) / local_198) - fVar29 * fVar29;
          local_1c8._0_4_ = local_1c8._0_4_ + fVar29;
          fVar31 = fVar31 + fVar30;
          dVar6 = (double)local_1e8._8_8_ + (double)(fVar30 * fVar30);
          local_1e8._8_4_ = SUB84(dVar6,0);
          local_1e8._0_8_ = (double)local_1e8._0_8_ + (double)(fVar29 * fVar29);
          local_1e8._12_4_ = (int)((ulong)dVar6 >> 0x20);
          iVar26 = iVar26 + 1;
          piVar25 = piVar25 + iVar19;
        }
        piVar16 = piVar16 + (ulong)bVar1 * (long)iVar24;
        lVar18 = local_1a0 + iVar24;
      }
      fVar29 = 0.0;
      fVar30 = 0.0;
      if (1 < iVar26) {
        fVar29 = (float)iVar20 / (float)(iVar13 * (int)local_1d0);
        fVar32 = (local_1c8._0_4_ + fVar29) / 5.0;
        fVar30 = (float)lVar27 / (float)(iVar13 * (int)local_1d0) - fVar29 * fVar29;
        local_1c8 = (double)local_1e8._8_8_ + (double)(fVar30 * fVar30);
        dVar6 = (double)(fVar29 * fVar29) + (double)local_1e8._0_8_;
        local_1e8._0_8_ = (undefined8)(iVar26 + 1);
        fVar32 = (float)(dVar6 / (double)local_1e8._0_8_) - fVar32 * fVar32;
        fVar29 = 0.0;
        if (0.0 < fVar32) {
          if (fVar32 < 0.0) {
            dStack_1c0 = (double)local_1e8._8_8_;
            fVar29 = sqrtf(fVar32);
          }
          else {
            fVar29 = SQRT(fVar32);
          }
        }
        fVar31 = (fVar31 + fVar30) / (float)(iVar26 + 1);
        fVar30 = (float)(local_1c8 / (double)local_1e8._0_8_) - fVar31 * fVar31;
      }
      psVar3 = x->plane[0].dequant_QTX;
      iVar19 = (int)*psVar3 >> 3;
      iVar13 = (int)psVar3[1] >> 3;
      if ((fVar29 <= (float)iVar19) &&
         ((float)*(int *)(&DAT_004650f0 + local_150 * 4) * fVar30 <= (float)(iVar13 * iVar13))) {
        bVar10 = false;
      }
      if ((fVar29 <= (float)(iVar19 * *(int *)(&DAT_004650e0 + local_150 * 4))) ||
         (fVar30 <= (float)(iVar13 * iVar13 * *(int *)(&DAT_004650e0 + local_150 * 4)))) {
        bVar28 = true;
      }
      else {
        bVar28 = false;
      }
    }
  }
  lVar15 = local_1b0;
  xd = &x->e_mbd;
  local_1e8._0_8_ = (long)iVar12;
  local_1c8 = (double)(ulong)ftxs_mode;
  if ((((cpi->sf).rt_sf.skip_tx_no_split_var_based_partition == 0) || (!bVar10)) ||
     (x->try_merge_partition == 0)) {
    bVar11 = bVar10;
    if (!bVar28) goto LAB_00219a9f;
LAB_00219914:
    pMVar4 = *(x->e_mbd).mi;
    bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar7];
    bVar21 = ""[uVar22];
    bVar2 = ""[uVar22];
    get_txb_ctx(plane_bsize,tx_size,0,ta + local_160,tl + local_1b0,(TXB_CTX *)features);
    iVar12 = (x->coeff_costs).coeff_costs[(uint)bVar21 + (uint)bVar2 + 1 >> 1 & 0xff][0].
             txb_skip_cost[(int)features[0]][1];
    rd_stats->zero_rate = iVar12;
    pMVar4->inter_tx_size
    [(blk_col >> (av1_get_txb_size_index_tw_w_log2_table[uVar7] & 0x1f)) +
     (((int)lVar15 >> (av1_get_txb_size_index_tw_h_log2_table[uVar7] & 0x1f)) <<
     (av1_get_txb_size_index_stride_log2_table[uVar7] & 0x1f))] = tx_size;
    tx_type_rd(cpi,x,tx_size,(int)lVar15,blk_col,block,(uint)plane_bsize,(TXB_CTX *)features,
               rd_stats,SUB81(local_1c8,0),ref_best_rd);
    bVar21 = 0;
    if ((x->e_mbd).lossless[*(ushort *)&pMVar4->field_0xa7 & 7] == 0) {
      if (rd_stats->skip_txfm == '\x01') {
        lVar15 = rd_stats->sse;
      }
      else {
        lVar15 = rd_stats->sse;
        if (rd_stats->dist * 0x80 + ((long)rd_stats->rate * (long)x->rdmult + 0x100 >> 9) <
            lVar15 * 0x80 + ((long)iVar12 * (long)x->rdmult + 0x100 >> 9)) {
          bVar21 = 0;
          goto LAB_00219b2f;
        }
      }
      rd_stats->rate = iVar12;
      rd_stats->dist = lVar15;
      x->plane[0].eobs[block] = 0;
      update_txk_array(xd,blk_row,blk_col,tx_size,'\0');
      bVar21 = 1;
    }
LAB_00219b2f:
    rd_stats->skip_txfm = bVar21;
    iVar12 = (uint)bVar1 * blk_row + blk_col;
    (x->txfm_search_info).blk_skip[iVar12] = (x->txfm_search_info).blk_skip[iVar12] & 0xfe | bVar21;
    iVar12 = rd_stats->rate;
    if (bVar17) {
      iVar12 = iVar12 + (x->mode_costs).txfm_partition_cost[local_1e8._0_8_][0];
      rd_stats->rate = iVar12;
    }
    lVar18 = rd_stats->dist * 0x80 + ((long)x->rdmult * (long)iVar12 + 0x100 >> 9);
    uVar23 = x->plane[0].txb_entropy_ctx[block];
    tx_type = (x->e_mbd).tx_type_map[(x->e_mbd).tx_type_map_stride * blk_row + blk_col];
    iVar12 = (cpi->sf).tx_sf.adaptive_txb_search_level;
    bVar11 = bVar10;
    if (iVar12 != 0) {
      cVar9 = (char)iVar12;
      if (ref_best_rd < lVar18 - (lVar18 >> (cVar9 + 1U & 0x3f))) goto LAB_0021a1a5;
      if (prev_level_rd < lVar18 - (lVar18 >> (cVar9 + 2U & 0x3f))) {
        bVar11 = false;
      }
    }
    if (((cpi->sf).tx_sf.txb_split_cap != 0) && (x->plane[0].eobs[block] == 0)) {
      bVar11 = false;
    }
  }
  else {
    bVar11 = true;
    uVar23 = '\0';
    tx_type = '\x10';
    if (x->plane[0].eobs[block] == 0) {
      lVar18 = 0x7fffffffffffffff;
      if (bVar28) goto LAB_00219914;
    }
    else {
LAB_00219a9f:
      tx_type = '\x10';
      uVar23 = '\0';
      lVar18 = 0x7fffffffffffffff;
    }
  }
  uVar8 = (uint)tx_size;
  if (((x->e_mbd).bd == 8) && (bVar11)) {
    if (((ref_best_rd != 0x7fffffffffffffff) || (lVar18 != 0x7fffffffffffffff)) &&
       (iVar12 = (cpi->sf).tx_sf.tx_type_search.ml_tx_split_thresh, -1 < iVar12)) {
      if (tx_size == '\0') {
        iVar13 = -1;
      }
      else {
        pNVar5 = av1_tx_split_nnconfig_map[uVar22];
        bVar1 = block_size_wide[uVar7];
        lVar15 = local_1b0 * (ulong)bVar1;
        piVar16 = x->plane[0].src_diff;
        iVar13 = *(int *)((long)tx_size_wide + (ulong)(uVar8 * 4));
        iVar19 = *(int *)((long)tx_size_high + (ulong)(uVar8 * 4));
        memset(features,0,0x100);
        get_mean_dev_features
                  (piVar16 + lVar15 * 4 + (long)(blk_col * 4),(uint)bVar1,iVar13,iVar19,features);
        x_sum = 0;
        (*av1_nn_predict)(features,pNVar5,1,(float *)&x_sum);
        iVar19 = 80000;
        if ((int)((float)x_sum * 10000.0) < 80000) {
          iVar19 = (int)((float)x_sum * 10000.0);
        }
        iVar13 = -80000;
        if (-80000 < iVar19) {
          iVar13 = iVar19;
        }
      }
      if (SBORROW4(iVar13,-iVar12) != iVar13 + iVar12 < 0) {
        lStack_178 = 0x7fffffffffffffff;
        goto LAB_0021a04e;
      }
    }
LAB_00219dc1:
    if (lVar18 < ref_best_rd) {
      ref_best_rd = lVar18;
    }
    iVar12 = max_block_high(xd,plane_bsize,(int)ref_best_rd);
    local_1a0 = CONCAT44(local_1a0._4_4_,iVar12);
    iVar24 = max_block_wide(xd,plane_bsize,plane);
    iVar12 = *(int *)((long)tx_size_wide_unit + (ulong)(uVar8 * 4));
    iVar13 = *(int *)((long)tx_size_high_unit + (ulong)(uVar8 * 4));
    bVar1 = ""[uVar22];
    iVar19 = tx_size_wide_unit[bVar1];
    iVar20 = tx_size_high_unit[bVar1];
    iVar26 = iVar20 * iVar19;
    iStack_180 = 0;
    lStack_178 = 0;
    local_170 = 0;
    local_168 = '\x01';
    iStack_184 = 0;
    x_sum = (x->mode_costs).txfm_partition_cost[local_1e8._0_8_][1];
    local_1a8 = (ulong)((int)local_1a8 + 1);
    local_190 = (long)((iVar12 / iVar19) * (iVar13 / iVar20));
    local_198 = (double)CONCAT44(local_198._4_4_,iVar19);
    uVar22 = 0;
    local_240 = block;
    while ((int)uVar22 < iVar13) {
      iVar14 = (int)uVar22 + blk_row;
      local_1e8._0_4_ = iVar14;
      if ((int)local_1a0 <= iVar14) break;
      local_1d0 = uVar22;
      for (iVar14 = 0; iVar14 < iVar12; iVar14 = iVar14 + iVar19) {
        if (blk_col + iVar14 < iVar24) {
          local_1ec = 1;
          select_tx_block(cpi,x,local_1e8._0_4_,blk_col + iVar14,local_240,bVar1,(int)local_1a8,
                          plane_bsize,ta,tl,tx_above,tx_left,(RD_STATS *)features,lVar18 / local_190
                          ,ref_best_rd - lStack_178,&local_1ec,SUB81(local_1c8,0));
          if (local_1ec != 0) {
            av1_merge_rd_stats((RD_STATS *)&x_sum,(RD_STATS *)features);
            lStack_178 = iStack_180 * 0x80 + ((long)x->rdmult * (long)x_sum + 0x100 >> 9);
            if (lStack_178 <= ref_best_rd) {
              local_240 = local_240 + iVar26;
              iVar19 = local_198._0_4_;
              goto LAB_0021a00c;
            }
          }
          lStack_178 = 0x7fffffffffffffff;
          goto LAB_0021a04e;
        }
LAB_0021a00c:
      }
      uVar22 = (ulong)(uint)((int)local_1d0 + iVar20);
    }
  }
  else {
    lStack_178 = 0x7fffffffffffffff;
    if (bVar11) goto LAB_00219dc1;
  }
LAB_0021a04e:
  if (lVar18 < lStack_178) {
    __s = tl + local_1b0;
    x->plane[0].txb_entropy_ctx[block] = uVar23;
    iVar12 = *(int *)((long)tx_size_wide_unit + (ulong)(uVar8 * 4));
    __c = (uint)x->plane[0].txb_entropy_ctx[block];
    memset(ta + local_160,__c,(long)iVar12);
    iVar13 = *(int *)((long)tx_size_high_unit + (ulong)(uVar8 * 4));
    memset(__s,__c,(long)iVar13);
    txfm_partition_update(local_140,local_148,tx_size,tx_size);
    iVar20 = 0;
    iVar19 = 0;
    if (0 < iVar12) {
      iVar19 = iVar12;
    }
    iVar12 = 0;
    if (0 < iVar13) {
      iVar12 = iVar13;
    }
    for (; iVar20 != iVar12; iVar20 = iVar20 + 1) {
      iVar13 = iVar19;
      iVar24 = blk_col;
      while (bVar28 = iVar13 != 0, iVar13 = iVar13 + -1, bVar28) {
        local_158->inter_tx_size
        [(iVar24 >> (av1_get_txb_size_index_tw_w_log2_table[uVar7] & 0x1f)) +
         ((iVar20 + blk_row >> (av1_get_txb_size_index_tw_h_log2_table[uVar7] & 0x1f)) <<
         (av1_get_txb_size_index_stride_log2_table[uVar7] & 0x1f))] = tx_size;
        iVar24 = iVar24 + 1;
      }
    }
    local_158->tx_size = tx_size;
    update_txk_array(xd,blk_row,blk_col,tx_size,tx_type);
    iVar12 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [uVar7] * blk_row + blk_col;
    (x->txfm_search_info).blk_skip[iVar12] =
         (x->txfm_search_info).blk_skip[iVar12] & 0xfe | rd_stats->skip_txfm != '\0';
    return;
  }
  *(ulong *)&rd_stats->skip_txfm = CONCAT71(uStack_167,local_168);
  rd_stats->rdcost = lStack_178;
  rd_stats->sse = local_170;
  rd_stats->rate = x_sum;
  rd_stats->zero_rate = iStack_184;
  rd_stats->dist = iStack_180;
  if (lStack_178 != 0x7fffffffffffffff) {
    return;
  }
LAB_0021a1a5:
  *is_cost_valid = 0;
  return;
}

Assistant:

static inline void select_tx_block(
    const AV1_COMP *cpi, MACROBLOCK *x, int blk_row, int blk_col, int block,
    TX_SIZE tx_size, int depth, BLOCK_SIZE plane_bsize, ENTROPY_CONTEXT *ta,
    ENTROPY_CONTEXT *tl, TXFM_CONTEXT *tx_above, TXFM_CONTEXT *tx_left,
    RD_STATS *rd_stats, int64_t prev_level_rd, int64_t ref_best_rd,
    int *is_cost_valid, FAST_TX_SEARCH_MODE ftxs_mode) {
  assert(tx_size < TX_SIZES_ALL);
  av1_init_rd_stats(rd_stats);
  if (ref_best_rd < 0) {
    *is_cost_valid = 0;
    return;
  }

  MACROBLOCKD *const xd = &x->e_mbd;
  assert(blk_row < max_block_high(xd, plane_bsize, 0) &&
         blk_col < max_block_wide(xd, plane_bsize, 0));
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int ctx = txfm_partition_context(tx_above + blk_col, tx_left + blk_row,
                                         mbmi->bsize, tx_size);
  struct macroblock_plane *const p = &x->plane[0];

  int try_no_split = (cpi->oxcf.txfm_cfg.enable_tx64 ||
                      txsize_sqr_up_map[tx_size] != TX_64X64) &&
                     (cpi->oxcf.txfm_cfg.enable_rect_tx ||
                      tx_size_wide[tx_size] == tx_size_high[tx_size]);
  int try_split = tx_size > TX_4X4 && depth < MAX_VARTX_DEPTH;
  TxCandidateInfo no_split = { INT64_MAX, 0, TX_TYPES };

  // Prune tx_split and no-split based on sub-block properties.
  if (tx_size != TX_4X4 && try_split == 1 && try_no_split == 1 &&
      cpi->sf.tx_sf.prune_tx_size_level > 0) {
    prune_tx_split_no_split(x, plane_bsize, blk_row, blk_col, tx_size,
                            &try_no_split, &try_split,
                            cpi->sf.tx_sf.prune_tx_size_level);
  }

  if (cpi->sf.rt_sf.skip_tx_no_split_var_based_partition) {
    if (x->try_merge_partition && try_split && p->eobs[block]) try_no_split = 0;
  }

  // Try using current block as a single transform block without split.
  if (try_no_split) {
    try_tx_block_no_split(cpi, x, blk_row, blk_col, block, tx_size, depth,
                          plane_bsize, ta, tl, ctx, rd_stats, ref_best_rd,
                          ftxs_mode, &no_split);

    // Speed features for early termination.
    const int search_level = cpi->sf.tx_sf.adaptive_txb_search_level;
    if (search_level) {
      if ((no_split.rd - (no_split.rd >> (1 + search_level))) > ref_best_rd) {
        *is_cost_valid = 0;
        return;
      }
      if (no_split.rd - (no_split.rd >> (2 + search_level)) > prev_level_rd) {
        try_split = 0;
      }
    }
    if (cpi->sf.tx_sf.txb_split_cap) {
      if (p->eobs[block] == 0) try_split = 0;
    }
  }

  // ML based speed feature to skip searching for split transform blocks.
  if (x->e_mbd.bd == 8 && try_split &&
      !(ref_best_rd == INT64_MAX && no_split.rd == INT64_MAX)) {
    const int threshold = cpi->sf.tx_sf.tx_type_search.ml_tx_split_thresh;
    if (threshold >= 0) {
      const int split_score =
          ml_predict_tx_split(x, plane_bsize, blk_row, blk_col, tx_size);
      if (split_score < -threshold) try_split = 0;
    }
  }

  RD_STATS split_rd_stats;
  split_rd_stats.rdcost = INT64_MAX;
  // Try splitting current block into smaller transform blocks.
  if (try_split) {
    try_tx_block_split(cpi, x, blk_row, blk_col, block, tx_size, depth,
                       plane_bsize, ta, tl, tx_above, tx_left, ctx, no_split.rd,
                       AOMMIN(no_split.rd, ref_best_rd), ftxs_mode,
                       &split_rd_stats);
  }

  if (no_split.rd < split_rd_stats.rdcost) {
    ENTROPY_CONTEXT *pta = ta + blk_col;
    ENTROPY_CONTEXT *ptl = tl + blk_row;
    p->txb_entropy_ctx[block] = no_split.txb_entropy_ctx;
    av1_set_txb_context(x, 0, block, tx_size, pta, ptl);
    txfm_partition_update(tx_above + blk_col, tx_left + blk_row, tx_size,
                          tx_size);
    for (int idy = 0; idy < tx_size_high_unit[tx_size]; ++idy) {
      for (int idx = 0; idx < tx_size_wide_unit[tx_size]; ++idx) {
        const int index =
            av1_get_txb_size_index(plane_bsize, blk_row + idy, blk_col + idx);
        mbmi->inter_tx_size[index] = tx_size;
      }
    }
    mbmi->tx_size = tx_size;
    update_txk_array(xd, blk_row, blk_col, tx_size, no_split.tx_type);
    const int bw = mi_size_wide[plane_bsize];
    set_blk_skip(x->txfm_search_info.blk_skip, 0, blk_row * bw + blk_col,
                 rd_stats->skip_txfm);
  } else {
    *rd_stats = split_rd_stats;
    if (split_rd_stats.rdcost == INT64_MAX) *is_cost_valid = 0;
  }
}